

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_utf8_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  ulong in_RAX;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  ulong local_38;
  int nByte;
  
  if (0 < nArg) {
    local_38 = in_RAX;
    pbVar2 = (byte *)jx9_value_to_string(*apArg,&nByte);
    if (0 < (long)nByte) {
      pbVar3 = pbVar2 + nByte;
      for (; pbVar2 < pbVar3; pbVar2 = pbVar2 + 1) {
        bVar1 = *pbVar2;
        uVar4 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          local_38 = CONCAT44(nByte,(uint)(bVar1 >> 6)) | 0xc0;
          jx9_result_string(pCtx,(char *)&stack0xffffffffffffffc8,1);
          uVar4 = bVar1 & 0xffffffbf;
        }
        local_38 = CONCAT44(nByte,uVar4);
        jx9_result_string(pCtx,(char *)&stack0xffffffffffffffc8,1);
      }
      return 0;
    }
  }
  jx9_result_null(pCtx);
  return 0;
}

Assistant:

static int vm_builtin_utf8_encode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn, *zEnd;
	int nByte, c, e;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = (const unsigned char *)jx9_value_to_string(apArg[0], &nByte);
	if( nByte < 1 ){
		/* Empty string, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zEnd = &zIn[nByte];
	/* Start the encoding process */
	for(;;){
		if( zIn >= zEnd ){
			/* End of input */
			break;
		}
		c = zIn[0];
		/* Advance the stream cursor */
		zIn++;
		/* Encode */
		if( c<0x00080 ){
			e = (c&0xFF);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		}else if( c<0x00800 ){
			e = 0xC0 + ((c>>6)&0x1F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + (c & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		}else if( c<0x10000 ){
			e = 0xE0 + ((c>>12)&0x0F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + ((c>>6) & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + (c & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		}else{
			e = 0xF0 + ((c>>18) & 0x07);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + ((c>>12) & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + ((c>>6) & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
			e = 0x80 + (c & 0x3F);
			jx9_result_string(pCtx, (const char *)&e, (int)sizeof(char));
		} 
	}
	/* All done */
	return JX9_OK;
}